

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O2

bool __thiscall
helics::TimeDependencies::checkIfReadyForTimeGrant
          (TimeDependencies *this,bool iterating,Time desiredGrantTime,GrantDelayMode delayMode)

{
  TimeState TVar1;
  DependencyInfo *pDVar2;
  bool bVar3;
  __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  __it;
  undefined7 in_register_00000031;
  pointer pDVar4;
  long lVar5;
  __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  _Var6;
  long lVar7;
  _Iter_negate<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_TimeDependencies_cpp:560:28)>
  local_40;
  
  if ((int)CONCAT71(in_register_00000031,iterating) == 0) {
    if (delayMode == WAITING) {
      pDVar4 = (this->dependencies).
               super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
               _M_impl.super__Vector_impl_data._M_start;
      while( true ) {
        bVar3 = pDVar4 == (this->dependencies).
                          super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
        if (bVar3) {
          return bVar3;
        }
        if ((pDVar4->dependency == true) &&
           (lVar7 = (pDVar4->super_TimeData).next.internalTimeCode,
           (pDVar4->connection != SELF && lVar7 != 0x7fffffffffffffff) &&
           lVar7 <= desiredGrantTime.internalTimeCode)) break;
        pDVar4 = pDVar4 + 1;
      }
      return bVar3;
    }
    if (delayMode != INTERRUPTED) {
      if (delayMode != NONE) {
        return true;
      }
      pDVar4 = (this->dependencies).
               super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
               _M_impl.super__Vector_impl_data._M_start;
      do {
        bVar3 = pDVar4 == (this->dependencies).
                          super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
        if (bVar3) {
          return bVar3;
        }
        if (((pDVar4->dependency == true) &&
            (lVar7 = (pDVar4->super_TimeData).next.internalTimeCode, lVar7 != 0x7fffffffffffffff))
           && (pDVar4->connection != SELF)) {
          if (lVar7 < desiredGrantTime.internalTimeCode) {
            return bVar3;
          }
          if (lVar7 == desiredGrantTime.internalTimeCode) {
            TVar1 = (pDVar4->super_TimeData).mTimeState;
            if (TVar1 == time_requested) {
              if (pDVar4->nonGranting != false) {
                return bVar3;
              }
            }
            else if (TVar1 == time_granted) {
              return bVar3;
            }
          }
        }
        pDVar4 = pDVar4 + 1;
      } while( true );
    }
    pDVar4 = (this->dependencies).
             super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      bVar3 = pDVar4 == (this->dependencies).
                        super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
      if (bVar3) {
        return bVar3;
      }
      if (((pDVar4->dependency == true) &&
          (lVar7 = (pDVar4->super_TimeData).next.internalTimeCode, lVar7 != 0x7fffffffffffffff)) &&
         (pDVar4->connection != SELF)) {
        if (lVar7 < desiredGrantTime.internalTimeCode) {
          return bVar3;
        }
        if (lVar7 == desiredGrantTime.internalTimeCode) {
          TVar1 = (pDVar4->super_TimeData).mTimeState;
          if (TVar1 == time_requested) {
            if (pDVar4->nonGranting != false) {
              return bVar3;
            }
          }
          else if (TVar1 == time_granted) {
            return bVar3;
          }
          if (((pDVar4->super_TimeData).interrupted == false) &&
             ((pDVar4->super_TimeData).delayedTiming != true)) {
            return bVar3;
          }
        }
      }
      pDVar4 = pDVar4 + 1;
    } while( true );
  }
  __it._M_current =
       (this->dependencies).
       super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
       super__Vector_impl_data._M_start;
  pDVar2 = (this->dependencies).
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar7 = (long)pDVar2 - (long)__it._M_current;
  local_40._M_pred.desiredGrantTime.internalTimeCode = desiredGrantTime.internalTimeCode;
  local_40._M_pred.delayMode = delayMode;
  for (lVar5 = lVar7 / 0x58 >> 2; 0 < lVar5; lVar5 = lVar5 + -1) {
    bVar3 = __gnu_cxx::__ops::
            _Iter_negate<helics::TimeDependencies::checkIfReadyForTimeGrant(bool,TimeRepresentation<count_time<9,long>>,helics::GrantDelayMode)const::$_0>
            ::operator()(&local_40,__it);
    _Var6._M_current = __it._M_current;
    if (bVar3) goto LAB_002e02ca;
    bVar3 = __gnu_cxx::__ops::
            _Iter_negate<helics::TimeDependencies::checkIfReadyForTimeGrant(bool,TimeRepresentation<count_time<9,long>>,helics::GrantDelayMode)const::$_0>
            ::operator()(&local_40,__it._M_current + 1);
    _Var6._M_current = __it._M_current + 1;
    if (bVar3) goto LAB_002e02ca;
    bVar3 = __gnu_cxx::__ops::
            _Iter_negate<helics::TimeDependencies::checkIfReadyForTimeGrant(bool,TimeRepresentation<count_time<9,long>>,helics::GrantDelayMode)const::$_0>
            ::operator()(&local_40,__it._M_current + 2);
    _Var6._M_current = __it._M_current + 2;
    if (bVar3) goto LAB_002e02ca;
    bVar3 = __gnu_cxx::__ops::
            _Iter_negate<helics::TimeDependencies::checkIfReadyForTimeGrant(bool,TimeRepresentation<count_time<9,long>>,helics::GrantDelayMode)const::$_0>
            ::operator()(&local_40,__it._M_current + 3);
    _Var6._M_current = __it._M_current + 3;
    if (bVar3) goto LAB_002e02ca;
    __it._M_current = __it._M_current + 4;
    lVar7 = lVar7 + -0x160;
  }
  lVar7 = lVar7 / 0x58;
  if (lVar7 != 1) {
    if (lVar7 != 2) {
      _Var6._M_current = pDVar2;
      if ((lVar7 != 3) ||
         (bVar3 = __gnu_cxx::__ops::
                  _Iter_negate<helics::TimeDependencies::checkIfReadyForTimeGrant(bool,TimeRepresentation<count_time<9,long>>,helics::GrantDelayMode)const::$_0>
                  ::operator()(&local_40,__it), _Var6._M_current = __it._M_current, bVar3))
      goto LAB_002e02ca;
      __it._M_current = __it._M_current + 1;
    }
    bVar3 = __gnu_cxx::__ops::
            _Iter_negate<helics::TimeDependencies::checkIfReadyForTimeGrant(bool,TimeRepresentation<count_time<9,long>>,helics::GrantDelayMode)const::$_0>
            ::operator()(&local_40,__it);
    _Var6._M_current = __it._M_current;
    if (bVar3) goto LAB_002e02ca;
    __it._M_current = __it._M_current + 1;
  }
  bVar3 = __gnu_cxx::__ops::
          _Iter_negate<helics::TimeDependencies::checkIfReadyForTimeGrant(bool,TimeRepresentation<count_time<9,long>>,helics::GrantDelayMode)const::$_0>
          ::operator()(&local_40,__it);
  _Var6._M_current = __it._M_current;
  if (!bVar3) {
    _Var6._M_current = pDVar2;
  }
LAB_002e02ca:
  return _Var6._M_current == pDVar2;
}

Assistant:

bool TimeDependencies::checkIfReadyForTimeGrant(bool iterating,
                                                Time desiredGrantTime,
                                                GrantDelayMode delayMode) const
{
    if (iterating) {
        return std::all_of(dependencies.begin(),
                           dependencies.end(),
                           [desiredGrantTime, delayMode](const auto& dep) {
                               return iteratingTimeGrantCheck(dep, desiredGrantTime, delayMode);
                           });
    }
    switch (delayMode) {
        case GrantDelayMode::NONE:
            for (const auto& dep : dependencies) {
                if (!dep.dependency || dep.next >= cBigTime) {
                    continue;
                }
                if (dep.connection == ConnectionType::SELF) {
                    continue;
                }
                if (dep.next < desiredGrantTime) {
                    return false;
                }
                if (dep.next == desiredGrantTime) {
                    if (dep.mTimeState == TimeState::time_granted) {
                        return false;
                    }
                    if (dep.mTimeState == TimeState::time_requested && dep.nonGranting) {
                        return false;
                    }
                }
            }
            break;
        case GrantDelayMode::INTERRUPTED:
            for (const auto& dep : dependencies) {
                if (!dep.dependency || dep.next >= cBigTime) {
                    continue;
                }
                if (dep.connection == ConnectionType::SELF) {
                    continue;
                }
                if (dep.next < desiredGrantTime) {
                    return false;
                }
                if (dep.next == desiredGrantTime) {
                    if (dep.mTimeState == TimeState::time_granted) {
                        return false;
                    }
                    if (dep.mTimeState == TimeState::time_requested && dep.nonGranting) {
                        return false;
                    }

                    if (dep.interrupted || dep.delayedTiming) {
                        continue;
                    }
                    return false;
                }
            }
            break;
        case GrantDelayMode::WAITING:
            for (const auto& dep : dependencies) {
                if (!dep.dependency || dep.next >= cBigTime) {
                    continue;
                }
                if (dep.connection == ConnectionType::SELF) {
                    continue;
                }
                if (dep.next <= desiredGrantTime) {
                    return false;
                }
            }
            break;
    }

    return true;
}